

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

LY_ERR lyb_parse_model(lylyb_ctx *lybctx,uint32_t parse_options,ly_bool with_features,
                      lys_module **mod)

{
  ulong uVar1;
  anon_union_8_3_0df1e6ad_for_ly_set_2 aVar2;
  LY_ERR LVar3;
  int iVar4;
  lys_module *mod_00;
  lysp_feature *last;
  LY_ERR LVar5;
  lys_module *feat_set_00;
  char *pcVar6;
  undefined7 in_register_00000011;
  char *pcVar7;
  ly_ctx *ctx;
  ulong uVar8;
  char *mod_name;
  uint32_t idx;
  char mod_rev [11];
  ly_set feat_set;
  char *local_78;
  lylyb_ctx *local_70;
  uint32_t local_68;
  char local_63 [11];
  lys_module **local_58;
  int local_4c;
  ly_ctx *local_48;
  anon_union_8_3_0df1e6ad_for_ly_set_2 aStack_40;
  
  iVar4 = (int)CONCAT71(in_register_00000011,with_features);
  mod_00 = (lys_module *)0x0;
  local_78 = (char *)0x0;
  local_48 = (ly_ctx *)0x0;
  aStack_40.dnodes = (lyd_node **)0x0;
  local_68 = 0;
  feat_set_00 = (lys_module *)&stack0xffffffffffffffb8;
  if (iVar4 == 0) {
    feat_set_00 = mod_00;
  }
  pcVar7 = local_63;
  LVar3 = lyb_read_model(lybctx,&local_78,pcVar7,(ly_set *)feat_set_00);
  pcVar6 = local_78;
  LVar5 = LY_EMEM;
  if (LVar3 == LY_SUCCESS) {
    local_70 = lybctx;
    local_4c = iVar4;
    if (local_63[0] == '\0') {
      mod_00 = ly_ctx_get_module_latest(lybctx->ctx,local_78);
    }
    else {
      mod_00 = ly_ctx_get_module(lybctx->ctx,local_78,local_63);
      if (mod_00 == (lys_module *)0x0 && (parse_options >> 0x14 & 1) != 0) {
        mod_00 = ly_ctx_get_module_implemented(local_70->ctx,pcVar6);
        if (mod_00 == (lys_module *)0x0) {
          mod_00 = (lys_module *)0x0;
        }
        else if ((mod_00->revision == (char *)0x0) ||
                (iVar4 = strcmp(mod_00->revision,local_63), iVar4 < 0)) {
          mod_00 = (lys_module *)0x0;
        }
      }
    }
    if ((mod_00 == (lys_module *)0x0) || (mod_00->implemented == '\0')) {
      LVar5 = LY_SUCCESS;
      if ((parse_options >> 0x11 & 1) != 0) {
        if (mod_00 == (lys_module *)0x0) {
          pcVar6 = "@";
          if (local_63[0] == '\0') {
            pcVar6 = "";
            pcVar7 = "";
          }
          ly_log(local_70->ctx,LY_LLERR,LY_EINVAL,
                 "Invalid context for LYB data parsing, missing module \"%s%s%s\".",local_78,pcVar6,
                 pcVar7);
          LVar5 = LY_EINVAL;
        }
        else {
          LVar5 = LY_EINVAL;
          if (mod_00->implemented == '\0') {
            pcVar6 = "@";
            if (local_63[0] == '\0') {
              pcVar6 = "";
              pcVar7 = "";
            }
            ly_log(local_70->ctx,LY_LLERR,LY_EINVAL,
                   "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
                   local_78,pcVar6,pcVar7);
            LVar5 = LY_EINVAL;
          }
        }
      }
    }
    else {
      local_58 = mod;
      if ((char)local_4c != '\0') {
        last = lysp_feature_next((lysp_feature *)0x0,mod_00->parsed,&local_68);
        aVar2 = aStack_40;
        while (aStack_40 = aVar2, last != (lysp_feature *)0x0) {
          uVar1 = (ulong)local_48 >> 0x20;
          if (uVar1 != 0) {
            pcVar7 = last->name;
            uVar8 = 0;
            do {
              iVar4 = strcmp((char *)aVar2.dnodes[uVar8],pcVar7);
              if (iVar4 == 0) {
                if ((last->flags & 0x20) != 0) goto LAB_0013a207;
                ctx = local_70->ctx;
                pcVar6 = 
                "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature disabled.";
                goto LAB_0013a356;
              }
              uVar8 = uVar8 + 1;
            } while (uVar1 != uVar8);
          }
          if ((last->flags & 0x20) != 0) {
            ctx = local_70->ctx;
            pcVar7 = last->name;
            pcVar6 = 
            "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature enabled.";
LAB_0013a356:
            ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar6,local_78,pcVar7);
            LVar5 = LY_EINVAL;
            mod = local_58;
            goto LAB_0013a2e6;
          }
LAB_0013a207:
          last = lysp_feature_next(last,mod_00->parsed,&local_68);
          aVar2 = aStack_40;
        }
      }
      lyb_cache_module_hash(mod_00);
      LVar5 = LY_SUCCESS;
      mod = local_58;
    }
  }
LAB_0013a2e6:
  *mod = mod_00;
  free(local_78);
  ly_set_erase((ly_set *)&stack0xffffffffffffffb8,free);
  return LVar5;
}

Assistant:

static LY_ERR
lyb_parse_model(struct lylyb_ctx *lybctx, uint32_t parse_options, ly_bool with_features, const struct lys_module **mod)
{
    LY_ERR ret = LY_SUCCESS;
    const struct lys_module *m = NULL;
    char *mod_name = NULL, mod_rev[LY_REV_SIZE];
    struct ly_set feat_set = {0};
    struct lysp_feature *f = NULL;
    uint32_t i, idx = 0;
    ly_bool enabled;

    /* read module info */
    if ((ret = lyb_read_model(lybctx, &mod_name, mod_rev, with_features ? &feat_set : NULL))) {
        goto cleanup;
    }

    /* get the module */
    if (mod_rev[0]) {
        m = ly_ctx_get_module(lybctx->ctx, mod_name, mod_rev);
        if ((parse_options & LYD_PARSE_LYB_MOD_UPDATE) && !m) {
            /* try to use an updated module */
            m = ly_ctx_get_module_implemented(lybctx->ctx, mod_name);
            if (m && (!m->revision || (strcmp(m->revision, mod_rev) < 0))) {
                /* not an implemented module in a newer revision */
                m = NULL;
            }
        }
    } else {
        m = ly_ctx_get_module_latest(lybctx->ctx, mod_name);
    }

    if (!m || !m->implemented) {
        if (parse_options & LYD_PARSE_STRICT) {
            if (!m) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, missing module \"%s%s%s\".",
                        mod_name, mod_rev[0] ? "@" : "", mod_rev[0] ? mod_rev : "");
            } else if (!m->implemented) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
                        mod_name, mod_rev[0] ? "@" : "", mod_rev[0] ? mod_rev : "");
            }
            ret = LY_EINVAL;
            goto cleanup;
        }

        goto cleanup;
    }

    if (with_features) {
        /* check features */
        while ((f = lysp_feature_next(f, m->parsed, &idx))) {
            enabled = 0;
            for (i = 0; i < feat_set.count; ++i) {
                if (!strcmp(feat_set.objs[i], f->name)) {
                    enabled = 1;
                    break;
                }
            }

            if (enabled && !(f->flags & LYS_FENABLED)) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature disabled.",
                        mod_name, f->name);
                ret = LY_EINVAL;
                goto cleanup;
            } else if (!enabled && (f->flags & LYS_FENABLED)) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature enabled.",
                        mod_name, f->name);
                ret = LY_EINVAL;
                goto cleanup;
            }
        }
    }

    /* fill cached hashes, if not already */
    lyb_cache_module_hash(m);

cleanup:
    *mod = m;
    free(mod_name);
    ly_set_erase(&feat_set, free);
    return ret;
}